

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O3

MemChunk * __thiscall
cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::arenaAlloc
          (MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *this,size_type chunkSize)

{
  SmallMemChunk *chunk;
  MemSegment *pMVar1;
  SmallMemChunk *curr;
  MemSegment *pMVar2;
  SmallMemChunk *pSVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  SmallMemChunk *pSVar7;
  size_type *psVar8;
  CircularList<cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
  *pCVar9;
  size_type segSize;
  size_type local_20;
  
  local_20 = chunkSize + 0x18;
  if ((0xffffffffffffffe7 < chunkSize) ||
     (((this->m_footprintLimit != 0 &&
       (uVar6 = this->m_footprint + local_20,
       this->m_footprintLimit < uVar6 || uVar6 <= this->m_footprint)) ||
      (pMVar2 = (MemSegment *)MmapArena::getSegment(this->m_arena,&local_20),
      pMVar2 == (MemSegment *)0x0)))) {
    return (MemChunk *)0x0;
  }
  uVar6 = this->m_footprint + local_20;
  this->m_footprint = uVar6;
  if (this->m_maxFootprint < uVar6) {
    this->m_maxFootprint = uVar6;
  }
  pMVar2->m_size = local_20;
  pMVar2->m_pad = 1;
  uVar6 = local_20 - 0x18;
  pMVar2[1].m_size = uVar6;
  *(ulong *)((long)pMVar2 + (local_20 - 8)) = uVar6;
  pMVar1 = this->m_segList;
  if (pMVar1 == (MemSegment *)0x0) {
    this->m_release_checks = 0xfff;
  }
  psVar8 = &pMVar2->m_pad;
  this->m_segList = pMVar2;
  pMVar2->m_next = pMVar1;
  uVar5 = (uVar6 & 0xfffffffffffffff0) - chunkSize;
  if (uVar5 < 0x20) {
    return (MemChunk *)psVar8;
  }
  chunk = (SmallMemChunk *)((long)psVar8 + chunkSize);
  pMVar2[1].m_size = chunkSize;
  *(size_type *)((long)&pMVar2->m_pad + chunkSize) = chunkSize;
  *(ulong *)((long)&pMVar2[1].m_size + chunkSize) = uVar5;
  *(ulong *)((long)&pMVar2->m_pad + (uVar6 & 0xfffffffffffffff0)) = uVar5;
  if (0xff < uVar5) {
    addLargeChunk(this,(MemChunk *)chunk);
    return (MemChunk *)psVar8;
  }
  uVar4 = (uint)(uVar5 >> 3) & 0x1e;
  pSVar3 = this->m_smallLists[uVar4].m_head;
  if (pSVar3 == (SmallMemChunk *)0x0) {
    pCVar9 = this->m_smallLists + uVar4;
    pSVar3 = chunk;
    pSVar7 = chunk;
  }
  else {
    pSVar7 = pSVar3->next;
    pSVar3->next = chunk;
    pCVar9 = (CircularList<cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
              *)&pSVar7->prev;
  }
  pCVar9->m_head = chunk;
  chunk->next = pSVar7;
  chunk->prev = pSVar3;
  if ((this->m_smallMap >> uVar4 & 1) != 0) {
    return (MemChunk *)psVar8;
  }
  this->m_smallMap = this->m_smallMap | 1 << (sbyte)uVar4;
  return (MemChunk *)psVar8;
}

Assistant:

MemChunk*
    arenaAlloc (size_type chunkSize)
    {
        size_type estSize;             /* allocation size */

        estSize = chunkSize + SEGMENT_OVERHEAD;
        if (estSize <= chunkSize)
        {
            // Technically can never reach here due to the MAX_REQUEST value
            //
            // However it is always good to have a check.
            return nullptr;
        }

        /*
         * Check user specified foot print limit
         */
        if (m_footprintLimit != 0)
        {
            size_type fp = m_footprint + estSize;
            if (fp <= m_footprint || fp > m_footprintLimit)
            {
                return nullptr;
            }
        }

        /*
         * Request memory segments from arena.
         */
        size_type segSize = estSize;
        MemSegment* seg = (MemSegment*)m_arena.getSegment (segSize);
        m_logger.logGetSegment (seg, segSize);

        /*
         * Initialize the segment obtained.
         */
        if (seg)
        {

            if ((m_footprint += segSize) > m_maxFootprint)
            {
                m_maxFootprint = m_footprint;
            }

            MemChunk* chunk = seg->init (segSize);

            if (m_segList == nullptr)
            {
                m_segList = seg;
                seg->setNext (nullptr);

                m_release_checks = MAX_RELEASE_CHECK_RATE;
            }
            else
            {
                seg->setNext (m_segList);
                m_segList = seg;
            }

            return splitChunk (chunk, chunkSize);
        }
        return nullptr;
    }